

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUIImage * __thiscall
irr::gui::CGUIEnvironment::addImage
          (CGUIEnvironment *this,ITexture *image,vector2d<int> pos,bool useAlphaChannel,
          IGUIElement *parent,s32 id,wchar_t *text)

{
  int *piVar1;
  long lVar2;
  CGUIImage *this_00;
  IGUIElement *parent_00;
  uint uVar3;
  uint uVar4;
  rect<int> rectangle;
  
  if (image == (ITexture *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar4 = (image->OriginalSize).Width;
    uVar3 = (image->OriginalSize).Height;
  }
  this_00 = (CGUIImage *)operator_new(0x188);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  rectangle.LowerRightCorner.Y = uVar3 + pos.Y;
  rectangle.LowerRightCorner.X = uVar4 + pos.X;
  rectangle.UpperLeftCorner = pos;
  CGUIImage::CGUIImage(this_00,&this->super_IGUIEnvironment,parent_00,id,rectangle);
  if (text != (wchar_t *)0x0) {
    (**(code **)(*(long *)this_00 + 0xa0))(this_00);
  }
  if (useAlphaChannel) {
    (**(code **)(*(long *)this_00 + 0x140))(this_00,1);
  }
  if (image != (ITexture *)0x0) {
    (**(code **)(*(long *)this_00 + 0x120))(this_00);
  }
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IGUIImage *)this_00;
}

Assistant:

IGUIImage *CGUIEnvironment::addImage(video::ITexture *image, core::position2d<s32> pos,
		bool useAlphaChannel, IGUIElement *parent, s32 id, const wchar_t *text)
{
	core::dimension2d<s32> sz(0, 0);
	if (image)
		sz = core::dimension2d<s32>(image->getOriginalSize());

	IGUIImage *img = new CGUIImage(this, parent ? parent : this,
			id, core::rect<s32>(pos, sz));

	if (text)
		img->setText(text);

	if (useAlphaChannel)
		img->setUseAlphaChannel(true);

	if (image)
		img->setImage(image);

	img->drop();
	return img;
}